

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testKNNValidatorNoDistanceFunction(void)

{
  KNearestNeighborsClassifier *nnModel;
  ostream *poVar1;
  undefined1 local_88 [8];
  Result res;
  NearestNeighborsIndex *nnIndex;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  nnModel = CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  CoreML::KNNValidatorTests::setNumberOfNeighbors(nnModel,3,true);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(nnModel);
  res.m_message.field_2._8_8_ =
       CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(nnModel);
  CoreML::Specification::NearestNeighborsIndex::mutable_linearindex
            ((NearestNeighborsIndex *)res.m_message.field_2._8_8_);
  CoreML::KNNValidatorTests::addDataPoints(nnModel);
  CoreML::KNNValidatorTests::addStringLabels(nnModel);
  CoreML::validate<(MLModelType)404>((Result *)local_88,(Model *)local_40);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_88);
  if (m1._oneof_case_[0]._0_1_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14d);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"!((res).good())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_88);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testKNNValidatorNoDistanceFunction() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_linearindex();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}